

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshDenoisingBase.cpp
# Opt level: O1

void __thiscall
MeshDenoisingBase::getFaceNormal
          (MeshDenoisingBase *this,TriMesh *mesh,
          vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          *normals)

{
  pointer pVVar1;
  double dVar2;
  double dVar3;
  size_type __new_size;
  PropertyT<OpenMesh::VectorT<double,_3>_> *this_00;
  const_reference pvVar4;
  BaseHandle _idx;
  FaceIter FVar5;
  undefined1 local_40 [8];
  FaceIter f_it;
  
  OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
  request_face_normals
            ((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity> *)
             mesh);
  OpenMesh::
  PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
  ::update_face_normals
            ((PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
              *)mesh);
  __new_size = (**(code **)(*(long *)&(mesh->super_Mesh).
                                      super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                      .
                                      super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                           + 0x28))(mesh);
  std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::resize
            (normals,__new_size);
  _local_40 = OpenMesh::PolyConnectivity::faces_begin((PolyConnectivity *)mesh);
  FVar5 = OpenMesh::PolyConnectivity::faces_end((PolyConnectivity *)mesh);
  if (f_it.mesh_._0_4_ != (BaseHandle)FVar5.hnd_.super_BaseHandle.idx_ ||
      local_40 != (undefined1  [8])FVar5.mesh_) {
    _idx = f_it.mesh_._0_4_;
    do {
      this_00 = OpenMesh::PropertyContainer::property<OpenMesh::VectorT<double,3>>
                          ((PropertyContainer *)
                           &(mesh->super_Mesh).
                            super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                            .
                            super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                            .field_0x68,
                           (BasePropHandleT<OpenMesh::VectorT<double,_3>_>)
                           (mesh->super_Mesh).
                           super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                           .
                           super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                           .face_normals_.super_BasePropHandleT<OpenMesh::VectorT<double,_3>_>.
                           super_BaseHandle.idx_);
      pvVar4 = OpenMesh::PropertyT<OpenMesh::VectorT<double,_3>_>::operator[](this_00,_idx.idx_);
      pVVar1 = (normals->
               super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      dVar2 = (pvVar4->super_VectorDataT<double,_3>).values_[0];
      dVar3 = (pvVar4->super_VectorDataT<double,_3>).values_[1];
      pVVar1[(int)f_it.mesh_._0_4_].super_VectorDataT<double,_3>.values_[2] =
           (pvVar4->super_VectorDataT<double,_3>).values_[2];
      pVVar1 = pVVar1 + (int)f_it.mesh_._0_4_;
      (pVVar1->super_VectorDataT<double,_3>).values_[0] = dVar2;
      (pVVar1->super_VectorDataT<double,_3>).values_[1] = dVar3;
      f_it.mesh_._0_4_ = (BaseHandle)(BaseHandle)((int)f_it.mesh_._0_4_ + 1);
      if (f_it.mesh_._4_4_ != 0) {
        OpenMesh::Iterators::
        GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
        ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                    *)local_40);
      }
      FVar5 = OpenMesh::PolyConnectivity::faces_end((PolyConnectivity *)mesh);
      _idx = f_it.mesh_._0_4_;
    } while (f_it.mesh_._0_4_ != (BaseHandle)FVar5.hnd_.super_BaseHandle.idx_ ||
             local_40 != (undefined1  [8])FVar5.mesh_);
  }
  return;
}

Assistant:

void MeshDenoisingBase::getFaceNormal(TriMesh &mesh, std::vector<TriMesh::Normal> &normals)
{
    mesh.request_face_normals();
    mesh.update_face_normals();

    normals.resize(mesh.n_faces());
    for(TriMesh::FaceIter f_it = mesh.faces_begin(); f_it != mesh.faces_end(); f_it++)
    {
        TriMesh::Normal n = mesh.normal(*f_it);
        normals[f_it->idx()] = n;
    }
}